

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O0

Seat * interactor_borrow_seat(Interactor *itr)

{
  _Bool _Var1;
  Seat *seat;
  Seat *tempseat;
  Seat *clientseat;
  Interactor *itr_local;
  
  itr_local = (Interactor *)interactor_get_seat(itr);
  if (itr_local == (Interactor *)0x0) {
    itr_local = (Interactor *)0x0;
  }
  else {
    _Var1 = is_tempseat((Seat *)itr_local);
    if (_Var1) {
      itr_local = (Interactor *)tempseat_get_real((Seat *)itr_local);
    }
    else {
      seat = tempseat_new((Seat *)itr_local);
      interactor_set_seat(itr,seat);
    }
  }
  return (Seat *)itr_local;
}

Assistant:

Seat *interactor_borrow_seat(Interactor *itr)
{
    Seat *clientseat = interactor_get_seat(itr);
    if (!clientseat)
        return NULL;

    /* If the client has already had its Seat borrowed, then look
     * through the existing TempSeat to find the underlying one. */
    if (is_tempseat(clientseat))
        return tempseat_get_real(clientseat);

    /* Otherwise, make a new TempSeat and give that to the client. */
    Seat *tempseat = tempseat_new(clientseat);
    interactor_set_seat(itr, tempseat);
    return clientseat;
}